

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * pugi::impl::anon_unknown_0::evaluate_node_set_prepare(xpath_query_impl *impl)

{
  xpath_value_type xVar1;
  xpath_exception *this;
  undefined1 local_28 [8];
  xpath_parse_result res;
  xpath_query_impl *impl_local;
  
  if (impl == (xpath_query_impl *)0x0) {
    impl_local = (xpath_query_impl *)0x0;
  }
  else {
    res.offset = (ptrdiff_t)impl;
    xVar1 = xpath_ast_node::rettype(impl->root);
    if (xVar1 != xpath_type_node_set) {
      xpath_parse_result::xpath_parse_result((xpath_parse_result *)local_28);
      local_28 = (undefined1  [8])0x18b5e3;
      this = (xpath_exception *)__cxa_allocate_exception(0x18);
      xpath_exception::xpath_exception(this,(xpath_parse_result *)local_28);
      __cxa_throw(this,&xpath_exception::typeinfo,xpath_exception::~xpath_exception);
    }
    impl_local = *(xpath_query_impl **)res.offset;
  }
  return (xpath_ast_node *)impl_local;
}

Assistant:

PUGI__FN impl::xpath_ast_node* evaluate_node_set_prepare(xpath_query_impl* impl)
	{
		if (!impl) return 0;

		if (impl->root->rettype() != xpath_type_node_set)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return 0;
		#else
			xpath_parse_result res;
			res.error = "Expression does not evaluate to node set";

			throw xpath_exception(res);
		#endif
		}

		return impl->root;
	}